

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

int Wlc_BlastReduction(Gia_Man_t *pNew,int *pFans,int nFans,int Type)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar4 = Type == 0x28;
  if ((bVar4) || (Type == 0x25)) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)nFans;
    if (nFans < 1) {
      uVar2 = uVar3;
    }
    iVar1 = 1;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      iVar1 = Gia_ManHashAnd(pNew,iVar1,pFans[uVar3]);
    }
  }
  else {
    bVar4 = Type == 0x29;
    if ((bVar4) || (Type == 0x26)) {
      uVar3 = 0;
      uVar2 = (ulong)(uint)nFans;
      if (nFans < 1) {
        uVar2 = uVar3;
      }
      iVar1 = 0;
      for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        iVar1 = Gia_ManHashOr(pNew,iVar1,pFans[uVar3]);
      }
    }
    else {
      bVar4 = Type == 0x2a;
      if ((!bVar4) && (Type != 0x27)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                      ,0xed,"int Wlc_BlastReduction(Gia_Man_t *, int *, int, int)");
      }
      uVar3 = 0;
      uVar2 = (ulong)(uint)nFans;
      if (nFans < 1) {
        uVar2 = uVar3;
      }
      iVar1 = 0;
      for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
        iVar1 = Gia_ManHashXor(pNew,iVar1,pFans[uVar3]);
      }
    }
  }
  iVar1 = Abc_LitNotCond(iVar1,(uint)bVar4);
  return iVar1;
}

Assistant:

int Wlc_BlastReduction( Gia_Man_t * pNew, int * pFans, int nFans, int Type )
{
    if ( Type == WLC_OBJ_REDUCT_AND || Type == WLC_OBJ_REDUCT_NAND )
    {
        int k, iLit = 1;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashAnd( pNew, iLit, pFans[k] );
        return Abc_LitNotCond( iLit, Type == WLC_OBJ_REDUCT_NAND );
    }
    if ( Type == WLC_OBJ_REDUCT_OR || Type == WLC_OBJ_REDUCT_NOR )
    {
        int k, iLit = 0;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashOr( pNew, iLit, pFans[k] );
        return Abc_LitNotCond( iLit, Type == WLC_OBJ_REDUCT_NOR );
    }
    if ( Type == WLC_OBJ_REDUCT_XOR || Type == WLC_OBJ_REDUCT_NXOR )
    {
        int k, iLit = 0;
        for ( k = 0; k < nFans; k++ )
            iLit = Gia_ManHashXor( pNew, iLit, pFans[k] );
        return Abc_LitNotCond( iLit, Type == WLC_OBJ_REDUCT_NXOR );
    }
    assert( 0 );
    return -1;
}